

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall
Clasp::Solver::postPropagate(Solver *this,PostPropagator **start,PostPropagator *stop)

{
  PostPropagator *pPVar1;
  int iVar2;
  PostPropagator **r;
  
  while ((pPVar1 = *start, pPVar1 != stop &&
         (iVar2 = (*(pPVar1->super_Constraint)._vptr_Constraint[0x14])(pPVar1,this,stop),
         (char)iVar2 != '\0'))) {
    if (pPVar1 == *start) {
      start = &pPVar1->next;
    }
  }
  return pPVar1 == stop;
}

Assistant:

bool Solver::postPropagate(PostPropagator** start, PostPropagator* stop) {
	for (PostPropagator** r = start, *t; *r != stop;) {
		t = *r;
		if (!t->propagateFixpoint(*this, stop)) { return false; }
		assert(queueSize() == 0);
		if (t == *r) { r = &t->next; }
		// else: t was removed during propagate
	}
	return true;
}